

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

int main(int argc,char **argv)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  time_t tVar5;
  undefined8 uVar6;
  long lVar7;
  int reset;
  char *pcVar8;
  ulong uVar9;
  bool bVar10;
  uint local_a0;
  uint local_9c;
  int local_90;
  char local_88 [88];
  
  uVar4 = 0;
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  al_set_org_name("liballeg.org");
  al_set_app_name("SPEED");
  cVar1 = al_install_system(0x5020700,atexit);
  if (cVar1 == '\0') {
    main_cold_1();
    return 1;
  }
  al_init_primitives_addon();
  if (argc < 2) {
    local_a0 = 0x40;
    bVar10 = true;
    local_9c = 0;
  }
  else {
    local_90 = 0;
    local_a0 = 0x40;
    uVar9 = 1;
    local_9c = 0;
    uVar4 = 0;
    do {
      pcVar8 = argv[uVar9];
      iVar2 = strcmp(pcVar8,"-cheat");
      if (iVar2 == 0) {
        cheat = -1;
      }
      else {
        iVar2 = strcmp(pcVar8,"-simple");
        if (iVar2 == 0) {
          low_detail = -1;
        }
        else {
          iVar2 = strcmp(pcVar8,"-nogrid");
          if (iVar2 == 0) {
            no_grid = -1;
          }
          else {
            iVar2 = strcmp(pcVar8,"-nomusic");
            if (iVar2 == 0) {
              no_music = -1;
            }
            else {
              iVar2 = strcmp(pcVar8,"-www");
              if (iVar2 == 0) {
                local_90 = -1;
              }
              else {
                iVar2 = strcmp(pcVar8,"-fullscreen");
                if (iVar2 == 0) {
                  uVar3 = 2;
                  if (uVar4 == 0) {
                    uVar3 = 0x200;
                  }
                  local_a0 = local_a0 | uVar3;
                }
                else {
                  uVar3 = atoi(pcVar8);
                  if (uVar3 == 0) goto LAB_001087f7;
                  if (uVar4 == 0) {
                    uVar4 = uVar3;
                    if (local_a0 >> 9 != 0) {
                      local_a0 = local_a0 & 0xfffffdfd | 2;
                    }
                  }
                  else {
                    bVar10 = local_9c != 0;
                    local_9c = uVar3;
                    if (bVar10) goto LAB_001087f7;
                  }
                }
              }
            }
          }
        }
      }
      uVar9 = uVar9 + 1;
    } while ((uint)argc != uVar9);
    bVar10 = local_90 == 0;
  }
  if (bVar10) {
    if (uVar4 == 0 || local_9c == 0) {
      local_9c = 0x1e0;
      uVar4 = 0x280;
      if ((argc != 1) && ((local_a0 & 0x200) == 0)) {
LAB_001087f7:
        pcVar8 = 
        "\nSPEED - by Shawn Hargreaves, 1999\nAllegro 5 port, 2010\n\nUsage: speed w h [options]\n\nThe w and h values set your desired screen resolution.\nWhat modes are available will depend on your hardware.\n\nAvailable options:\n\n\t-fullscreen enables full screen mode. (w and h are optional)\n\t-cheat makes you invulnerable.\n\t-simple turns off the more expensive graphics effects.\n\t-nogrid turns off the wireframe background grid.\n\t-nomusic turns off my most excellent background music.\n\t-www invokes the built-in web browser.\n\nExample usage:\n\n\tspeed 640 480"
        ;
        goto LAB_001087fe;
      }
    }
    al_set_new_display_option(0x11,1,2);
    al_set_new_display_option(0x12,4,2);
    al_set_new_display_flags(local_a0);
    screen = (ALLEGRO_DISPLAY *)al_create_display(uVar4,local_9c);
    if (screen == (ALLEGRO_DISPLAY *)0x0) {
      fprintf(_stderr,"Error setting %dx%d display mode\n",(ulong)uVar4,(ulong)local_9c);
      return 1;
    }
    al_init_font_addon();
    al_set_new_bitmap_flags(1);
    font = (ALLEGRO_FONT *)al_create_builtin_font();
    if (font == (ALLEGRO_FONT *)0x0) {
      main_cold_3();
      return 1;
    }
    al_set_new_bitmap_flags(0x400);
    font_video = (ALLEGRO_FONT *)al_create_builtin_font();
    if (font_video != (ALLEGRO_FONT *)0x0) {
      al_install_keyboard();
      al_install_joystick();
      cVar1 = al_install_audio();
      if ((cVar1 != '\0') && (cVar1 = al_reserve_samples(8), cVar1 == '\0')) {
        al_uninstall_audio();
      }
      init_input();
      init_sound();
      init_hiscore();
      iVar2 = title_screen();
      if (iVar2 != 0) {
        do {
          score = 0;
          init_view();
          init_player();
          init_badguys();
          init_bullets();
          init_explode();
          init_message();
          uVar6 = al_create_timer(0x3f91111111111111);
          al_start_timer(uVar6);
          bVar10 = true;
          iVar2 = 0;
          do {
            lVar7 = al_get_timer_count(uVar6);
            if (0 < lVar7) {
              do {
                update_view();
                update_bullets();
                update_explode();
                update_message();
                iVar2 = update_badguys();
                if (iVar2 != 0) {
                  reset = 0;
                  iVar2 = advance_view();
                  if (iVar2 != 0) {
                    al_set_timer_count(uVar6,0);
                    reset = -1;
                  }
                  lay_attack_wave(reset);
                  advance_player(reset);
                }
                iVar2 = update_player();
                lVar7 = al_get_timer_count(uVar6);
                al_set_timer_count(uVar6,lVar7 + -1);
                lVar7 = al_get_timer_count(uVar6);
                bVar10 = true;
              } while ((0 < lVar7) && (iVar2 == 0));
            }
            if (key[0x5c] != 0) {
              play_game_ss_count = play_game_ss_count + 1;
              sprintf(local_88,"speed%03d.tga");
              al_get_backbuffer(screen);
              al_save_bitmap(local_88);
              while (key[0x5c] != 0) {
                poll_input_wait();
              }
              al_set_timer_count(uVar6,0);
            }
            if (key[6] != 0) {
              uVar4 = al_get_display_flags(screen);
              al_set_display_flag(screen,0x200,(uVar4 >> 9 & 1) == 0);
              while (key[6] != 0) {
                poll_input_wait();
              }
            }
            if (bVar10) {
              draw_view();
            }
            else {
              rest(1);
            }
            bVar10 = false;
          } while (iVar2 == 0);
          al_destroy_timer(uVar6);
          shutdown_view();
          shutdown_player();
          shutdown_badguys();
          shutdown_bullets();
          shutdown_explode();
          shutdown_message();
          if (iVar2 < 0) {
            sfx_ping(1);
          }
          else {
            show_results();
            score_table();
          }
          iVar2 = title_screen();
        } while (iVar2 != 0);
      }
      shutdown_hiscore();
      shutdown_sound();
      goodbye();
      shutdown_input();
      al_destroy_font(font);
      al_destroy_font(font_video);
      return 0;
    }
    main_cold_2();
  }
  else {
    pcVar8 = 
    "\nUnfortunately the built-in web browser feature had to be removed.\n\nI did get it more or less working as of Saturday evening (forms and\nJava were unsupported, but tables and images were mostly rendering ok),\nbut the US Department of Justice felt that this was an unacceptable\nmonopolistic attempt to tie in web browsing functionality to an\nunrelated product, so they threatened me with being sniped at from\nthe top of tall buildings by guys with high powered rifles unless I\nagreed to disable this code.\n\nWe apologise for any inconvenience that this may cause you."
    ;
LAB_001087fe:
    puts(pcVar8);
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[])
{
   int w = 0, h = 0;
   int www = FALSE;
   int i, n;
   int display_flags = ALLEGRO_GENERATE_EXPOSE_EVENTS;

   srand(time(NULL));
   
   al_set_org_name("liballeg.org");
   al_set_app_name("SPEED");

   if (!al_init()) {
      fprintf(stderr, "Could not initialise Allegro.\n");
      return 1;
   }
   al_init_primitives_addon();

   /* parse the commandline */
   for (i=1; i<argc; i++) {
      if (strcmp(argv[i], "-cheat") == 0) {
         cheat = TRUE;
      }
      else if (strcmp(argv[i], "-simple") == 0) {
         low_detail = TRUE;
      }
      else if (strcmp(argv[i], "-nogrid") == 0) {
         no_grid = TRUE;
      }
      else if (strcmp(argv[i], "-nomusic") == 0) {
         no_music = TRUE;
      }
      else if (strcmp(argv[i], "-www") == 0) {
         www = TRUE;
      }
      else if (strcmp(argv[i], "-fullscreen") == 0) {
         /* if no width is specified, assume fullscreen_window */
         display_flags |= w ? ALLEGRO_FULLSCREEN : ALLEGRO_FULLSCREEN_WINDOW;
      }
      else {
         n = atoi(argv[i]);

         if (!n) {
            usage();
            return 1;
         }

         if (!w) {
            w = n;
            if (display_flags & ALLEGRO_FULLSCREEN_WINDOW) {
               /* toggle from fullscreen_window to fullscreen */
               display_flags &= ~ALLEGRO_FULLSCREEN_WINDOW;
               display_flags |= ALLEGRO_FULLSCREEN;
            }
         }
         else if (!h) {
            h = n;
         }
         else {
            usage();
            return 1;
         }
      }
   }

   /* it's a real shame that I had to take this out! */
   if (www) {
      printf(
	 "\n"
	 "Unfortunately the built-in web browser feature had to be removed.\n"
	 "\n"
	 "I did get it more or less working as of Saturday evening (forms and\n"
	 "Java were unsupported, but tables and images were mostly rendering ok),\n"
	 "but the US Department of Justice felt that this was an unacceptable\n"
	 "monopolistic attempt to tie in web browsing functionality to an\n"
	 "unrelated product, so they threatened me with being sniped at from\n"
	 "the top of tall buildings by guys with high powered rifles unless I\n"
	 "agreed to disable this code.\n"
	 "\n"
	 "We apologise for any inconvenience that this may cause you.\n"
      );

      return 1;
   }
   
   if (!w || !h) {
      if (argc == 1 || (display_flags & ALLEGRO_FULLSCREEN_WINDOW)) {
         w = 640;
         h = 480;
      }
      else {
         usage();
         return 1;
      }
   }

   /* set the screen mode */
   al_set_new_display_option(ALLEGRO_SAMPLE_BUFFERS, 1, ALLEGRO_SUGGEST);
   al_set_new_display_option(ALLEGRO_SAMPLES, 4, ALLEGRO_SUGGEST);

   al_set_new_display_flags(display_flags);
   screen = al_create_display(w, h);
   if (!screen) {
      fprintf(stderr, "Error setting %dx%d display mode\n", w, h);
      return 1;
   }

   /* To avoid performance problems on graphics drivers that don't support
    * drawing to textures, we build up transition screens on memory bitmaps.
    * We need a font loaded into a memory bitmap for those, then a font
    * loaded into a video bitmap for the game view. Blech!
    */
   al_init_font_addon();
   al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   font = al_create_builtin_font();
   if (!font) {
      fprintf(stderr, "Error creating builtin font\n");
      return 1;
   }

   al_set_new_bitmap_flags(ALLEGRO_VIDEO_BITMAP);
   font_video = al_create_builtin_font();
   if (!font_video) {
      fprintf(stderr, "Error creating builtin font\n");
      return 1;
   }

   /* set up everything else */
   al_install_keyboard();
   al_install_joystick();
   if (al_install_audio()) {
      if (!al_reserve_samples(8))
         al_uninstall_audio();
   }

   init_input();
   init_sound();
   init_hiscore();

   /* the main program body */
   while (title_screen()) {
      if (play_game()) {
	 show_results();
	 score_table();
      }
   }

   /* time to go away now */
   shutdown_hiscore();
   shutdown_sound();

   goodbye();

   shutdown_input();

   al_destroy_font(font);
   al_destroy_font(font_video);

   return 0;
}